

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O1

complex<float> cdotc(int n,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  float fVar1;
  float fVar2;
  float fVar3;
  complex<float> in_RAX;
  complex<float> cVar4;
  ulong uVar5;
  float *pfVar6;
  float *pfVar7;
  
  if (n < 1) {
    return (complex<float>)in_RAX._M_value;
  }
  cVar4._M_value = (_ComplexT_conflict)(incx ^ 1U);
  if (incy == 1 && (incx ^ 1U) == 0) {
    uVar5 = 0;
    do {
      fVar1 = *(float *)&cx[uVar5]._M_value;
      fVar2 = *(float *)((long)&cx[uVar5]._M_value + 4);
      fVar3 = *(float *)((long)&cy[uVar5]._M_value + 4);
      if ((NAN(fVar2 * fVar3 + fVar1 * *(float *)&cy[uVar5]._M_value)) &&
         (NAN(fVar1 * fVar3 - fVar2 * *(float *)&cy[uVar5]._M_value))) {
        cVar4._M_value = __mulsc3(fVar1,-fVar2);
      }
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
  }
  else {
    cVar4._M_value = (_ComplexT_conflict)(incx >> 0x1f & (1 - n) * incx);
    pfVar7 = (float *)((long)&cy[incy >> 0x1f & (1 - n) * incy]._M_value + 4);
    pfVar6 = (float *)((long)&cx[cVar4._M_value]._M_value + 4);
    do {
      fVar1 = pfVar6[-1];
      fVar2 = *pfVar6;
      if ((NAN(fVar2 * *pfVar7 + fVar1 * pfVar7[-1])) && (NAN(fVar1 * *pfVar7 - fVar2 * pfVar7[-1]))
         ) {
        cVar4._M_value = __mulsc3(fVar1,-fVar2);
      }
      pfVar7 = pfVar7 + (long)incy * 2;
      pfVar6 = pfVar6 + (long)incx * 2;
      n = n + -1;
    } while (n != 0);
  }
  return (complex<float>)cVar4._M_value;
}

Assistant:

complex <float> cdotc ( int n, complex <float> cx[], int incx,
  complex <float> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CDOTC forms the conjugated dot product of two vectors.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, complex <float> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries in CX.
//
//    Input, complex <float> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries in CY.
//
//    Output, complex <float> CDOTC, the conjugated dot product of
//    the corresponding entries of CX and CY.
//
{
  int i;
  int ix;
  int iy;
  complex <float> value;

  value = complex <float> ( 0.0, 0.0 );

  if ( n <= 0 )
  {
    return value;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + conj ( cx[i] ) * cy[i];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      value = value + conj ( cx[ix] ) * cy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return value;
}